

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerHLSL::to_initializer_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRVariable *var)

{
  bool bVar1;
  SPIRType *pSVar2;
  SPIRConstant *c;
  
  pSVar2 = Compiler::get<spirv_cross::SPIRType>
                     ((Compiler *)this,*(uint32_t *)&(var->super_IVariant).field_0xc);
  bVar1 = Compiler::has_decoration((Compiler *)this,(ID)(pSVar2->super_IVariant).self.id,Block);
  c = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,(var->initializer).id);
  if (c == (SPIRConstant *)0x0 || !bVar1) {
    CompilerGLSL::to_initializer_expression_abi_cxx11_
              (__return_storage_ptr__,&this->super_CompilerGLSL,var);
  }
  else {
    CompilerGLSL::constant_expression_abi_cxx11_
              (__return_storage_ptr__,&this->super_CompilerGLSL,c,false,false);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerHLSL::to_initializer_expression(const SPIRVariable &var)
{
	// We cannot emit static const initializer for block constants for practical reasons,
	// so just inline the initializer.
	// FIXME: There is a theoretical problem here if someone tries to composite extract
	// into this initializer since we don't declare it properly, but that is somewhat non-sensical.
	auto &type = get<SPIRType>(var.basetype);
	bool is_block = has_decoration(type.self, DecorationBlock);
	auto *c = maybe_get<SPIRConstant>(var.initializer);
	if (is_block && c)
		return constant_expression(*c);
	else
		return CompilerGLSL::to_initializer_expression(var);
}